

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O3

void __thiscall HModel::setup_tightenBound(HModel *this)

{
  vector<double,_std::allocator<double>_> *__x;
  vector<double,_std::allocator<double>_> *__x_00;
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  pointer piVar6;
  int *piVar7;
  pointer pdVar8;
  pointer pdVar9;
  pointer pdVar10;
  pointer pdVar11;
  undefined1 auVar12 [16];
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  pointer pdVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  uint uVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  int k;
  int iVar25;
  bool bVar26;
  ulong uVar27;
  ulong uVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined4 uVar34;
  undefined4 uVar35;
  uint uVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  vector<double,_std::allocator<double>_> ARvalue;
  vector<int,_std::allocator<int>_> ARindex;
  vector<int,_std::allocator<int>_> ARstart;
  vector<int,_std::allocator<int>_> iwork;
  vector<double,_std::allocator<double>_> colLower0;
  vector<double,_std::allocator<double>_> colUpper0;
  vector<double,_std::allocator<double>_> local_d8;
  vector<int,_std::allocator<int>_> local_c0;
  vector<int,_std::allocator<int>_> local_a8;
  vector<int,_std::allocator<int>_> local_90;
  HModel *local_78;
  pointer local_70;
  pointer local_68;
  vector<double,_std::allocator<double>_> local_60;
  vector<double,_std::allocator<double>_> local_48;
  
  if (this->intOption[3] == 0) {
    return;
  }
  local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_90,(long)this->numRow,(value_type *)&local_a8,(allocator_type *)&local_c0);
  local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_a8,(long)this->numRow + 1,(value_type *)&local_c0,(allocator_type *)&local_d8);
  uVar20 = (uint)((ulong)((long)(this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl
                                .super__Vector_impl_data._M_finish -
                         (long)(this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 2);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_c0,(long)(int)uVar20,(allocator_type *)&local_d8);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_d8,(long)(int)uVar20,(allocator_type *)&local_60);
  if (0 < (int)uVar20) {
    piVar6 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar19 = 0;
    do {
      local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[piVar6[uVar19]] =
           local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[piVar6[uVar19]] + 1;
      uVar19 = uVar19 + 1;
    } while ((uVar20 & 0x7fffffff) != uVar19);
  }
  if (0 < this->numRow) {
    iVar17 = *(int *)CONCAT44(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_,
                              local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._0_4_);
    lVar22 = 0;
    do {
      iVar17 = iVar17 + local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar22];
      ((int *)CONCAT44(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_))[lVar22 + 1] = iVar17;
      lVar22 = lVar22 + 1;
    } while (lVar22 < this->numRow);
    if (0 < this->numRow) {
      lVar22 = 0;
      do {
        local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar22] =
             *(int *)(CONCAT44(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start._4_4_,
                               local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start._0_4_) + lVar22 * 4);
        lVar22 = lVar22 + 1;
      } while (lVar22 < this->numRow);
    }
  }
  iVar17 = this->numCol;
  if (0 < iVar17) {
    piVar7 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar8 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar21 = *piVar7;
    lVar22 = 0;
    do {
      lVar23 = lVar22 + 1;
      iVar4 = piVar7[lVar22 + 1];
      if (iVar21 < piVar7[lVar22 + 1]) {
        lVar24 = (long)iVar21;
        do {
          iVar17 = piVar6[lVar24];
          iVar21 = local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar17];
          local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[iVar17] = iVar21 + 1;
          *(int *)(CONCAT44(local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._0_4_) + (long)iVar21 * 4) =
               (int)lVar22;
          local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[iVar21] = pdVar8[lVar24];
          lVar24 = lVar24 + 1;
        } while (lVar24 < piVar7[lVar23]);
        iVar17 = this->numCol;
        iVar4 = piVar7[lVar23];
      }
      iVar21 = iVar4;
      lVar22 = lVar23;
    } while (lVar23 < iVar17);
  }
  __x = &this->colLower;
  std::vector<double,_std::allocator<double>_>::vector(&local_60,__x);
  __x_00 = &this->colUpper;
  std::vector<double,_std::allocator<double>_>::vector(&local_48,__x_00);
  uVar20 = this->numRow;
  local_68 = (this->rowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  uVar14 = 0;
  while (0 < (int)uVar20) {
    pdVar8 = (this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_70 = (pointer)CONCAT44(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start._4_4_,
                                 local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start._0_4_);
    pdVar9 = (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar10 = (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar19 = 0;
    iVar17 = 0;
    do {
      dVar30 = local_68[uVar19];
      if ((-10000000000.0 <= dVar30) || (pdVar8[uVar19] <= 10000000000.0)) {
        iVar21 = *(int *)((long)local_70 + uVar19 * 4);
        lVar22 = (long)iVar21;
        iVar4 = *(int *)((long)local_70 + uVar19 * 4 + 4);
        if (iVar21 < iVar4) {
          pdVar16 = (__x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          pdVar11 = (__x_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          auVar33 = ZEXT816(0);
          iVar18 = 0;
          iVar25 = 0;
          lVar23 = lVar22;
          do {
            iVar5 = *(int *)(CONCAT44(local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      .super__Vector_impl_data._M_start._4_4_,
                                      local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      .super__Vector_impl_data._M_start._0_4_) + lVar23 * 4);
            dVar29 = local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar23];
            if (dVar29 <= 0.0) {
              dVar31 = pdVar11[iVar5];
              uVar15 = (uint)((ulong)pdVar16[iVar5] >> 0x20) ^ 0x80000000;
              uVar34 = SUB84(pdVar16[iVar5],0);
              uVar36 = (uint)((ulong)dVar31 >> 0x20) ^ 0x80000000;
              uVar35 = SUB84(dVar31,0);
            }
            else {
              dVar31 = pdVar11[iVar5];
              uVar34 = SUB84(dVar31,0);
              uVar15 = (uint)((ulong)dVar31 >> 0x20);
              uVar35 = SUB84(pdVar16[iVar5],0);
              uVar36 = (uint)((ulong)pdVar16[iVar5] >> 0x20);
            }
            uVar27 = -(ulong)(10000000000.0 <= (double)CONCAT44(uVar15,uVar34));
            uVar28 = -(ulong)((double)CONCAT44(uVar36,uVar35) <= -10000000000.0);
            iVar18 = iVar18 - (int)uVar27;
            uVar13 = ~uVar28 & (ulong)(ABS(dVar29) * (double)CONCAT44(uVar36,uVar35) + auVar33._8_8_
                                      );
            auVar32._0_8_ = (ulong)auVar33._0_8_ & uVar27;
            auVar32._8_8_ = (ulong)auVar33._8_8_ & uVar28;
            auVar12._8_4_ = (int)uVar13;
            auVar12._0_8_ =
                 ~uVar27 & (ulong)(ABS(dVar29) * (double)CONCAT44(uVar15,uVar34) + auVar33._0_8_);
            auVar12._12_4_ = (int)(uVar13 >> 0x20);
            auVar33 = auVar32 | auVar12;
            iVar25 = iVar25 - (int)uVar28;
            lVar23 = lVar23 + 1;
          } while (iVar4 != lVar23);
        }
        else {
          auVar33 = ZEXT816(0);
          iVar25 = 0;
          iVar18 = 0;
          pdVar16 = local_70;
        }
        dVar29 = ABS(auVar33._0_8_) * 1e-08 + auVar33._0_8_;
        dVar31 = ABS(auVar33._8_8_) * -1e-08 + auVar33._8_8_;
        lVar23 = -(ulong)(100000000.0 < ABS(dVar31));
        auVar33._8_4_ = (int)lVar23;
        auVar33._0_8_ = -(ulong)(100000000.0 < ABS(dVar29));
        auVar33._12_4_ = (int)((ulong)lVar23 >> 0x20);
        uVar15 = movmskpd((int)pdVar16,auVar33);
        dVar39 = 0.0;
        if ((uVar15 & 2) == 0) {
          dVar40 = 0.0;
        }
        else {
          dVar40 = ABS(dVar31) * 1e-12;
        }
        if ((uVar15 & 1) != 0) {
          dVar39 = ABS(dVar29) * 1e-12;
        }
        dVar1 = pdVar8[uVar19];
        if (((dVar1 + 1e-07 < (double)iVar18 * 1e+31 + dVar29) ||
            ((double)iVar25 * -1e+31 + dVar31 < dVar30 + -1e-07)) && (iVar21 < iVar4)) {
          do {
            dVar38 = local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar22];
            iVar21 = *(int *)(CONCAT44(local_c0.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start._4_4_,
                                       local_c0.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start._0_4_) + lVar22 * 4)
            ;
            dVar2 = pdVar9[iVar21];
            dVar3 = pdVar10[iVar21];
            uVar34 = SUB84(dVar3,0);
            uVar35 = (undefined4)((ulong)dVar3 >> 0x20);
            dVar41 = (dVar30 - dVar29) / dVar38;
            if (dVar38 <= 0.0) {
              dVar41 = (double)(1 - iVar18) * dVar2 + dVar41 + dVar39;
              if (iVar18 != 0) {
                dVar41 = (double)((ulong)dVar41 & -(ulong)(dVar2 < -10000000000.0) |
                                 ~-(ulong)(dVar2 < -10000000000.0) & 0x6974e718d7d7625a);
              }
              if (1 < iVar18 || dVar30 <= -10000000000.0) {
                dVar41 = 1e+200;
              }
              if (iVar25 != 0 && dVar3 <= 10000000000.0 || (1 < iVar25 || 10000000000.0 <= dVar1)) {
                dVar37 = -1e+200;
              }
              else {
                dVar37 = ((double)(1 - iVar25) * dVar3 + (dVar1 - dVar31) / dVar38) - dVar40;
              }
LAB_0012ce8e:
              if ((dVar41 < dVar3 + -1e-12) && (dVar41 < 10000000000.0)) {
                dVar38 = dVar2;
                if (dVar2 <= dVar41) {
                  dVar38 = dVar41;
                }
                pdVar10[iVar21] = dVar38;
                iVar17 = iVar17 + 1;
              }
            }
            else {
              dVar37 = ((double)(1 - iVar18) * dVar3 + dVar41) - dVar39;
              if (iVar18 != 0) {
                dVar37 = (double)((ulong)dVar37 & -(ulong)(10000000000.0 < dVar3) |
                                 ~-(ulong)(10000000000.0 < dVar3) & 0xe974e718d7d7625a);
              }
              if (1 < iVar18 || dVar30 <= -10000000000.0) {
                dVar37 = -1e+200;
              }
              if ((iVar25 == 0 || dVar2 < -10000000000.0) && (1 >= iVar25 && 10000000000.0 > dVar1))
              {
                dVar41 = (double)(1 - iVar25) * dVar2 + (dVar1 - dVar31) / dVar38 + dVar40;
                goto LAB_0012ce8e;
              }
            }
            if ((dVar2 + 1e-12 < dVar37) && (-10000000000.0 < dVar37)) {
              if (dVar37 <= dVar3) {
                uVar34 = SUB84(dVar37,0);
                uVar35 = (undefined4)((ulong)dVar37 >> 0x20);
              }
              pdVar9[iVar21] = (double)CONCAT44(uVar35,uVar34);
              iVar17 = iVar17 + 1;
            }
            lVar22 = lVar22 + 1;
          } while (lVar22 < iVar4);
        }
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 != uVar20);
    if ((iVar17 == 0) || (bVar26 = 9 < uVar14, uVar14 = (iVar17 != 0) + uVar14, bVar26)) break;
  }
  iVar17 = this->numCol;
  local_78 = this;
  if ((long)iVar17 < 1) {
    if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start == (pointer)0x0) goto LAB_0012d028;
  }
  else {
    pdVar8 = (__x_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar9 = (__x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar22 = 0;
    do {
      dVar30 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar22];
      dVar29 = local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar22];
      if (dVar29 + 0.001 < dVar30) {
        dVar31 = pdVar8[lVar22];
        dVar39 = pdVar9[lVar22];
        if (0.00100001 <= dVar31 - dVar39) {
          if (dVar31 < dVar30) {
            if (dVar31 + 0.1 <= dVar30) {
              dVar30 = dVar31 + 0.1;
            }
            pdVar8[lVar22] = dVar30;
            dVar39 = pdVar9[lVar22];
            dVar29 = local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar22];
          }
          if (dVar29 < dVar39) {
            if (dVar39 + -0.1 <= dVar29) {
              dVar29 = dVar39 + -0.1;
            }
            pdVar9[lVar22] = dVar29;
          }
        }
        else {
          dVar30 = dVar39 + -0.1;
          if (dVar39 + -0.1 <= dVar29) {
            dVar30 = dVar29;
          }
          pdVar9[lVar22] = dVar30;
          dVar30 = pdVar8[lVar22] + 0.1;
          if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar22] <= pdVar8[lVar22] + 0.1) {
            dVar30 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar22];
          }
          pdVar8[lVar22] = dVar30;
        }
      }
      lVar22 = lVar22 + 1;
    } while (iVar17 != lVar22);
  }
  operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start);
LAB_0012d028:
  if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((void *)CONCAT44(local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._0_4_));
  }
  if ((void *)CONCAT44(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._0_4_));
  }
  if (local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void HModel::setup_tightenBound() {
    if (intOption[INTOPT_TIGHT_FLAG] == 0)
        return;

    // Make a AR copy
    vector<int> iwork(numRow, 0);
    vector<int> ARstart(numRow + 1, 0);
    int AcountX = Aindex.size();
    vector<int> ARindex(AcountX);
    vector<double> ARvalue(AcountX);
    for (int k = 0; k < AcountX; k++)
        iwork[Aindex[k]]++;
    for (int i = 1; i <= numRow; i++)
        ARstart[i] = ARstart[i - 1] + iwork[i - 1];
    for (int i = 0; i < numRow; i++)
        iwork[i] = ARstart[i];
    for (int iCol = 0; iCol < numCol; iCol++) {
        for (int k = Astart[iCol]; k < Astart[iCol + 1]; k++) {
            int iRow = Aindex[k];
            int iPut = iwork[iRow]++;
            ARindex[iPut] = iCol;
            ARvalue[iPut] = Avalue[k];
        }
    }

    // Save column bounds
    vector<double> colLower0 = colLower;
    vector<double> colUpper0 = colUpper;

    double big_B = 1e10;
    int iPass = 0;
    for (;;) {
        int numberChanged = 0;
        for (int iRow = 0; iRow < numRow; iRow++) {
            // SKIP free rows
            if (rowLower[iRow] < -big_B && rowUpper[iRow] > big_B)
                continue;

            // possible row
            int ninfU = 0;
            int ninfL = 0;
            double xmaxU = 0.0;
            double xminL = 0.0;
            int myStart = ARstart[iRow];
            int myEnd = ARstart[iRow + 1];
            // Compute possible lower and upper ranges

            for (int k = myStart; k < myEnd; ++k) {
                int iCol = ARindex[k];
                double value = ARvalue[k];
                double upper = value > 0 ? colUpper[iCol] : -colLower[iCol];
                double lower = value > 0 ? colLower[iCol] : -colUpper[iCol];
                value = fabs(value);
                if (upper < big_B)
                    xmaxU += upper * value;
                else
                    ++ninfU;
                if (lower > -big_B)
                    xminL += lower * value;
                else
                    ++ninfL;
            }

            // Build in a margin of error
            xmaxU += 1.0e-8 * fabs(xmaxU);
            xminL -= 1.0e-8 * fabs(xminL);

            double xminLmargin =
                    (fabs(xminL) > 1.0e8) ? 1e-12 * fabs(xminL) : 0;
            double xmaxUmargin =
                    (fabs(xmaxU) > 1.0e8) ? 1e-12 * fabs(xmaxU) : 0;

            // Skip redundant row : also need to consider U < L  case
            double comp_U = xmaxU + ninfU * 1.0e31;
            double comp_L = xminL - ninfL * 1.0e31;
            if (comp_U <= rowUpper[iRow] + 1e-7
                    && comp_L >= rowLower[iRow] - 1e-7)
                continue;

            double row_L = rowLower[iRow];
            double row_U = rowUpper[iRow];

            // Now see if we can tighten column bounds
            for (int k = myStart; k < myEnd; ++k) {
                double value = ARvalue[k];
                int iCol = ARindex[k];
                double col_L = colLower[iCol];
                double col_U = colUpper[iCol];
                double new_L = -HSOL_CONST_INF;
                double new_U = +HSOL_CONST_INF;

                if (value > 0.0) {
                    if (row_L > -big_B && ninfU <= 1
                            && (ninfU == 0 || col_U > +big_B))
                        new_L = (row_L - xmaxU) / value + (1 - ninfU) * col_U
                                - xmaxUmargin;
                    if (row_U < +big_B && ninfL <= 1
                            && (ninfL == 0 || col_L < -big_B))
                        new_U = (row_U - xminL) / value + (1 - ninfL) * col_L
                                + xminLmargin;
                } else {
                    if (row_L > -big_B && ninfU <= 1
                            && (ninfU == 0 || col_L < -big_B))
                        new_U = (row_L - xmaxU) / value + (1 - ninfU) * col_L
                                + xmaxUmargin;
                    if (row_U < +big_B && ninfL <= 1
                            && (ninfL == 0 || col_U > +big_B))
                        new_L = (row_U - xminL) / value + (1 - ninfL) * col_U
                                - xminLmargin;
                }

                if (new_U < col_U - 1.0e-12 && new_U < big_B) {
                    colUpper[iCol] = max(new_U, col_L);
                    numberChanged++;
                }
                if (new_L > col_L + 1.0e-12 && new_L > -big_B) {
                    colLower[iCol] = min(new_L, col_U);
                    numberChanged++;
                }
            }
        }

        if (numberChanged == 0)
            break;
        iPass++;
        if (iPass > 10)
            break;

    }

    double useTolerance = 1.0e-3;
    for (int iCol = 0; iCol < numCol; iCol++) {
        if (colUpper0[iCol] > colLower0[iCol] + useTolerance) {
            const double relax = 100.0 * useTolerance;
            if (colUpper[iCol] - colLower[iCol] < useTolerance + 1.0e-8) {
                colLower[iCol] = max(colLower0[iCol], colLower[iCol] - relax);
                colUpper[iCol] = min(colUpper0[iCol], colUpper[iCol] + relax);
            } else {
                if (colUpper[iCol] < colUpper0[iCol]) {
                    colUpper[iCol] = min(colUpper[iCol] + relax,
                            colUpper0[iCol]);
                }
                if (colLower[iCol] > colLower0[iCol]) {
                    colLower[iCol] = min(colLower[iCol] - relax,
                            colLower0[iCol]);
                }
            }
        }
    }
}